

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O3

aiLight * __thiscall
Assimp::BlenderImporter::ConvertLight
          (BlenderImporter *this,Scene *param_1,Object *obj,Lamp *lamp,ConversionData *param_4)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ai_uint32 aVar5;
  aiLight *paVar6;
  size_t sVar7;
  char *__s;
  float fVar8;
  float fVar9;
  float fVar10;
  
  paVar6 = (aiLight *)operator_new(0x46c);
  (paVar6->mName).length = 0;
  (paVar6->mName).data[0] = '\0';
  memset((paVar6->mName).data + 1,0x1b,0x3ff);
  paVar6->mType = aiLightSource_UNDEFINED;
  (paVar6->mPosition).x = 0.0;
  (paVar6->mPosition).y = 0.0;
  (paVar6->mPosition).z = 0.0;
  (paVar6->mDirection).x = 0.0;
  (paVar6->mDirection).y = 0.0;
  *(undefined8 *)&(paVar6->mDirection).z = 0;
  (paVar6->mUp).x = 0.0;
  (paVar6->mUp).y = 0.0;
  *(undefined8 *)&(paVar6->mUp).z = 0;
  paVar6->mAttenuationLinear = 1.0;
  paVar6->mAttenuationQuadratic = 0.0;
  (paVar6->mColorDiffuse).r = 0.0;
  (paVar6->mColorDiffuse).g = 0.0;
  (paVar6->mColorDiffuse).b = 0.0;
  (paVar6->mColorSpecular).r = 0.0;
  (paVar6->mColorSpecular).g = 0.0;
  *(undefined8 *)&(paVar6->mColorSpecular).b = 0;
  (paVar6->mColorAmbient).g = 0.0;
  (paVar6->mColorAmbient).b = 0.0;
  paVar6->mAngleInnerCone = 6.2831855;
  paVar6->mAngleOuterCone = 6.2831855;
  (paVar6->mSize).x = 0.0;
  (paVar6->mSize).y = 0.0;
  __s = (obj->id).name + 2;
  sVar7 = strlen(__s);
  aVar5 = (ai_uint32)sVar7;
  if ((int)aVar5 < 0x400) {
    (paVar6->mName).length = aVar5;
    memcpy((paVar6->mName).data,__s,(long)(int)aVar5);
    (paVar6->mName).data[(int)aVar5] = '\0';
  }
  if (Type_Area < lamp->type) goto switchD_004cf802_caseD_3;
  switch(lamp->type) {
  case Type_Local:
    paVar6->mType = aiLightSource_POINT;
    break;
  case Type_Sun:
    paVar6->mType = aiLightSource_DIRECTIONAL;
    goto LAB_004cf8a1;
  case Type_Spot:
    paVar6->mType = aiLightSource_SPOT;
    (paVar6->mDirection).x = 0.0;
    (paVar6->mDirection).y = 0.0;
    *(undefined8 *)&(paVar6->mDirection).z = 0xbf800000;
    (paVar6->mUp).y = 1.0;
    (paVar6->mUp).z = 0.0;
    fVar9 = lamp->spotsize;
    paVar6->mAngleInnerCone = (1.0 - lamp->spotblend) * fVar9;
    paVar6->mAngleOuterCone = fVar9;
    break;
  case Type_Area:
    paVar6->mType = aiLightSource_AREA;
    fVar9 = lamp->area_size;
    if (lamp->area_shape != 0) {
      fVar9 = lamp->area_sizey;
    }
    (paVar6->mSize).x = lamp->area_size;
    (paVar6->mSize).y = fVar9;
LAB_004cf8a1:
    (paVar6->mDirection).x = 0.0;
    (paVar6->mDirection).y = 0.0;
    *(undefined8 *)&(paVar6->mDirection).z = 0xbf800000;
    (paVar6->mUp).y = 1.0;
    (paVar6->mUp).z = 0.0;
  }
switchD_004cf802_caseD_3:
  fVar9 = lamp->energy;
  fVar10 = lamp->b * fVar9;
  (paVar6->mColorAmbient).b = fVar10;
  (paVar6->mColorSpecular).b = fVar10;
  uVar1 = lamp->r;
  uVar3 = lamp->g;
  fVar8 = fVar9 * (float)uVar1;
  fVar9 = fVar9 * (float)uVar3;
  (paVar6->mColorAmbient).r = fVar8;
  (paVar6->mColorAmbient).g = fVar9;
  (paVar6->mColorSpecular).r = fVar8;
  (paVar6->mColorSpecular).g = fVar9;
  (paVar6->mColorDiffuse).r = fVar8;
  (paVar6->mColorDiffuse).g = fVar9;
  (paVar6->mColorDiffuse).b = fVar10;
  uVar2 = lamp->constant_coefficient;
  uVar4 = lamp->linear_coefficient;
  if (((((float)uVar2 != 1.0) || (NAN((float)uVar2))) || ((float)uVar4 != 0.0)) ||
     (((NAN((float)uVar4) || (lamp->quadratic_coefficient != 0.0)) ||
      ((NAN(lamp->quadratic_coefficient) || (fVar9 = lamp->dist, fVar9 <= 0.0)))))) {
    paVar6->mAttenuationConstant = (float)uVar2;
    paVar6->mAttenuationLinear = (float)uVar4;
    fVar9 = lamp->quadratic_coefficient;
  }
  else {
    paVar6->mAttenuationConstant = 1.0;
    paVar6->mAttenuationLinear = 2.0 / fVar9;
    fVar9 = 1.0 / (fVar9 * fVar9);
  }
  paVar6->mAttenuationQuadratic = fVar9;
  return paVar6;
}

Assistant:

aiLight* BlenderImporter::ConvertLight(const Scene& /*in*/, const Object* obj, const Lamp* lamp, ConversionData& /*conv_data*/)
{
    std::unique_ptr<aiLight> out(new aiLight());
    out->mName = obj->id.name+2;

    switch (lamp->type)
    {
        case Lamp::Type_Local:
            out->mType = aiLightSource_POINT;
            break;
        case Lamp::Type_Spot:
            out->mType = aiLightSource_SPOT;

            // blender orients directional lights as facing toward -z
            out->mDirection = aiVector3D(0.f, 0.f, -1.f);
            out->mUp = aiVector3D(0.f, 1.f, 0.f);

            out->mAngleInnerCone = lamp->spotsize * (1.0f - lamp->spotblend);
            out->mAngleOuterCone = lamp->spotsize;
            break;
        case Lamp::Type_Sun:
            out->mType = aiLightSource_DIRECTIONAL;

            // blender orients directional lights as facing toward -z
            out->mDirection = aiVector3D(0.f, 0.f, -1.f);
            out->mUp = aiVector3D(0.f, 1.f, 0.f);
            break;

        case Lamp::Type_Area:
            out->mType = aiLightSource_AREA;

            if (lamp->area_shape == 0) {
                out->mSize = aiVector2D(lamp->area_size, lamp->area_size);
            }
            else {
                out->mSize = aiVector2D(lamp->area_size, lamp->area_sizey);
            }

            // blender orients directional lights as facing toward -z
            out->mDirection = aiVector3D(0.f, 0.f, -1.f);
            out->mUp = aiVector3D(0.f, 1.f, 0.f);
            break;

        default:
            break;
    }

    out->mColorAmbient = aiColor3D(lamp->r, lamp->g, lamp->b) * lamp->energy;
    out->mColorSpecular = aiColor3D(lamp->r, lamp->g, lamp->b) * lamp->energy;
    out->mColorDiffuse = aiColor3D(lamp->r, lamp->g, lamp->b) * lamp->energy;

    // If default values are supplied, compute the coefficients from light's max distance
    // Read this: https://imdoingitwrong.wordpress.com/2011/01/31/light-attenuation/
    //
    if (lamp->constant_coefficient == 1.0f && lamp->linear_coefficient == 0.0f && lamp->quadratic_coefficient == 0.0f && lamp->dist > 0.0f)
    {
        out->mAttenuationConstant = 1.0f;
        out->mAttenuationLinear = 2.0f / lamp->dist;
        out->mAttenuationQuadratic = 1.0f / (lamp->dist * lamp->dist);
    }
    else
    {
        out->mAttenuationConstant = lamp->constant_coefficient;
        out->mAttenuationLinear = lamp->linear_coefficient;
        out->mAttenuationQuadratic = lamp->quadratic_coefficient;
    }

    return out.release();
}